

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * cmOutputConverter::EscapeForCMake(string *__return_storage_ptr__,string *str)

{
  char *local_38;
  char *c;
  allocator local_1a;
  undefined1 local_19;
  string *local_18;
  string *str_local;
  string *result;
  
  local_19 = 0;
  local_18 = str;
  str_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"\"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  for (local_38 = (char *)std::__cxx11::string::c_str(); *local_38 != '\0'; local_38 = local_38 + 1)
  {
    if (*local_38 == '\"') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\"");
    }
    else if (*local_38 == '$') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\$");
    }
    else if (*local_38 == '\\') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*local_38);
    }
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::EscapeForCMake(const std::string& str)
{
  // Always double-quote the argument to take care of most escapes.
  std::string result = "\"";
  for(const char* c = str.c_str(); *c; ++c)
    {
    if(*c == '"')
      {
      // Escape the double quote to avoid ending the argument.
      result += "\\\"";
      }
    else if(*c == '$')
      {
      // Escape the dollar to avoid expanding variables.
      result += "\\$";
      }
    else if(*c == '\\')
      {
      // Escape the backslash to avoid other escapes.
      result += "\\\\";
      }
    else
      {
      // Other characters will be parsed correctly.
      result += *c;
      }
    }
  result += "\"";
  return result;
}